

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O1

UBool __thiscall
icu_63::InitialTimeZoneRule::operator==(InitialTimeZoneRule *this,TimeZoneRule *that)

{
  char *__s1;
  char *__s2;
  UBool UVar1;
  int iVar2;
  
  if (&this->super_TimeZoneRule == that) {
    UVar1 = '\x01';
  }
  else {
    __s1 = *(char **)((this->super_TimeZoneRule).super_UObject._vptr_UObject[-1] + 8);
    __s2 = *(char **)((that->super_UObject)._vptr_UObject[-1] + 8);
    if (__s1 == __s2) {
LAB_00208b1a:
      UVar1 = TimeZoneRule::operator==(&this->super_TimeZoneRule,that);
      return UVar1;
    }
    if (*__s1 != '*') {
      iVar2 = strcmp(__s1,__s2);
      if (iVar2 == 0) goto LAB_00208b1a;
    }
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

UBool
InitialTimeZoneRule::operator==(const TimeZoneRule& that) const {
    return ((this == &that) ||
            (typeid(*this) == typeid(that) &&
            TimeZoneRule::operator==(that)));
}